

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

vocwdef * vocfnw(voccxdef *voccx,vocseadef *search_ctx)

{
  byte bVar1;
  vocwdef *pvVar2;
  vocwdef *pvVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  vocdef *pvVar7;
  vocwdef *pvVar8;
  vocdef *pvVar9;
  vocwdef *local_38;
  
  pvVar9 = search_ctx->v;
  pvVar2 = search_ctx->vw;
  uVar5 = pvVar2->vocwnxt;
  if (uVar5 == 0xffffffff) {
    pvVar8 = (vocwdef *)0x0;
  }
  else {
    pvVar8 = (vocwdef *)
             ((long)&voccx->voccxwp[(ulong)uVar5 / 2000]->vocwnxt + (ulong)(uVar5 % 2000 << 3));
  }
  pvVar7 = (vocdef *)0x0;
  bVar6 = false;
  do {
    if ((pvVar7 != (vocdef *)0x0) || (pvVar9 == (vocdef *)0x0)) {
      search_ctx->v = pvVar7;
      if (pvVar7 == (vocdef *)0x0) {
        local_38 = (vocwdef *)0x0;
      }
      search_ctx->vw = local_38;
      return local_38;
    }
    pvVar3 = local_38;
    if (bVar6) {
      bVar1 = pvVar9->voclen;
      iVar4 = voceq(search_ctx->wrd1,search_ctx->len1,pvVar9->voctxt,(uint)bVar1);
      if (iVar4 == 0) {
        pvVar7 = (vocdef *)0x0;
      }
      else {
        iVar4 = voceq(search_ctx->wrd2,search_ctx->len2,pvVar9->voctxt + bVar1,(uint)pvVar9->vocln2)
        ;
        if (iVar4 != 0) {
          uVar5 = pvVar9->vocwlst;
          if (uVar5 != 0xffffffff) goto LAB_001f4f8a;
          pvVar8 = (vocwdef *)0x0;
          goto LAB_001f4f63;
        }
        pvVar7 = (vocdef *)0x0;
      }
    }
    else {
LAB_001f4f63:
      while (pvVar8 != (vocwdef *)0x0) {
        if ((pvVar2->vocwtyp == pvVar8->vocwtyp) &&
           (pvVar7 = pvVar9, pvVar3 = pvVar8, (pvVar8->vocwflg & 9) == 0)) goto LAB_001f4fb3;
        uVar5 = pvVar8->vocwnxt;
        pvVar8 = (vocwdef *)0x0;
        if (uVar5 != 0xffffffff) {
LAB_001f4f8a:
          pvVar8 = (vocwdef *)
                   ((long)&voccx->voccxwp[(ulong)uVar5 / 2000]->vocwnxt + (ulong)(uVar5 % 2000 << 3)
                   );
        }
      }
      pvVar8 = (vocwdef *)0x0;
      pvVar7 = (vocdef *)0x0;
      pvVar3 = local_38;
    }
LAB_001f4fb3:
    local_38 = pvVar3;
    pvVar9 = pvVar9->vocnxt;
    bVar6 = true;
  } while( true );
}

Assistant:

vocwdef *vocfnw(voccxdef *voccx, vocseadef *search_ctx)
{
    vocdef  *v, *vf;
    vocwdef *vw, *vwf;
    vocdef  *c = search_ctx->v;
    int      first;

    /* continue with current word's vocwdef list if anything is left */
    first = TRUE;
    vw = vocwget(voccx, search_ctx->vw->vocwnxt);

    /* keep going until we run out of hash chain entries or find a match */
    for (v = c, vf = 0 ; v != 0 && vf == 0 ; v = v->vocnxt, first = FALSE)
    {
        /* if this word matches, look at the objects in its list */
        if (first
            || (voceq(search_ctx->wrd1, search_ctx->len1,
                      v->voctxt, v->voclen)
                && voceq(search_ctx->wrd2, search_ctx->len2,
                         v->voctxt + v->voclen, v->vocln2)))
        {
            /*
             *   on the first time through, vw has already been set up
             *   with the next vocwdef in the current list; on subsequent
             *   times through the loop, start at the head of the current
             *   word's list 
             */
            if (!first)
                vw = vocwget(voccx, v->vocwlst);

            /* search the list from vw forward */
            for ( ; vw ; vw = vocwget(voccx, vw->vocwnxt))
            {
                if (search_ctx->vw->vocwtyp == vw->vocwtyp
                    && !(vw->vocwflg & VOCFCLASS)
                    && !(vw->vocwflg & VOCFDEL))
                {
                    /*
                     *   remember the first vocdef that we found, and
                     *   remember this, the first matching vocwdef, then
                     *   stop scanning 
                     */
                    vf = v;
                    vwf = vw;
                    break;
                }
            }
        }
    }

    /* return the first vocwdef in this word's list */
    search_ctx->v = vf;
    search_ctx->vw = (vf ? vwf : 0);
    return(search_ctx->vw);
}